

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult ReadFromFile(ShellState *state,char **azArg,idx_t nArg)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,azArg[1],&local_31);
  bVar1 = duckdb_shell::ShellState::ReadFromFile(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return !bVar1;
}

Assistant:

MetadataResult ReadFromFile(ShellState &state, const char **azArg, idx_t nArg) {
	if (!state.ReadFromFile(azArg[1])) {
		return MetadataResult::FAIL;
	}
	return MetadataResult::SUCCESS;
}